

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O1

string * __thiscall
ninx::lexer::Reader::read_until_limiter_abi_cxx11_(string *__return_storage_ptr__,Reader *this)

{
  pointer *ppcVar1;
  pointer pcVar2;
  iterator iVar3;
  vector<char,std::allocator<char>> *pvVar4;
  string sVar5;
  char cVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  char current;
  allocator local_59;
  vector<char,std::allocator<char>> *local_58;
  string local_50;
  undefined7 uStack_4f;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  pcVar2 = (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish != pcVar2) {
    (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  local_58 = (vector<char,std::allocator<char>> *)&this->buffer;
  bVar10 = false;
  do {
    if (((byte)this->stream[*(long *)(*(long *)this->stream + -0x18) + 0x20] & 5) != 0) break;
    cVar6 = std::istream::peek();
    if (cVar6 == '\\') {
      std::istream::get();
LAB_0010d2bc:
      local_50 = (string)std::istream::get();
      if (local_50 == (string)0xff) goto LAB_0010d36e;
      if ((local_50 == (string)0x2d) && (iVar7 = std::istream::peek(), 9 < iVar7 - 0x30U)) {
        std::istream::seekg((long)this->stream,~_S_beg);
        goto LAB_0010d36e;
      }
      sVar5 = local_50;
      if ((char)local_50 == 10) {
        this->line_number = this->line_number + 1;
        bVar10 = true;
      }
      else {
        iVar7 = isspace((int)(char)local_50);
        if (iVar7 == 0) {
          bVar10 = false;
        }
      }
      if ((sVar5 == (string)0xa) || (bVar8 = true, !bVar10)) {
        iVar3._M_current =
             (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    (local_58,iVar3,(char *)&local_50);
        }
        else {
          *iVar3._M_current = (char)sVar5;
          ppcVar1 = &(this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        bVar8 = true;
      }
    }
    else {
      bVar8 = false;
      lVar9 = 0;
      do {
        if ((&LIMITER_CHARS)[lVar9] == cVar6) {
          bVar8 = true;
          break;
        }
        bVar11 = lVar9 != 0x11;
        lVar9 = lVar9 + 1;
      } while (bVar11);
      if ((cVar6 == '-') || (!bVar8)) goto LAB_0010d2bc;
LAB_0010d36e:
      bVar8 = false;
    }
  } while (bVar8);
  pvVar4 = local_58;
  local_50 = (string)0x0;
  iVar3._M_current =
       (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              ((vector<char,_std::allocator<char>_> *)local_58,iVar3,(char *)&local_50);
  }
  else {
    *iVar3._M_current = '\0';
    ppcVar1 = &(this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  std::__cxx11::string::string(&local_50,*(char **)pvVar4,&local_59);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((size_type *)CONCAT71(uStack_4f,local_50) == &local_40) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)CONCAT71(uStack_4f,local_50);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40;
  }
  __return_storage_ptr__->_M_string_length = local_48;
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::Reader::read_until_limiter() {
    this->buffer.clear();

    bool line_started {false};  // Used to discard indentations

    while (stream) {
        // Check if the next char is one of the limiting ones
        char next_char = static_cast<char>(stream.peek());
        if (next_char == '\\') {   // Escaping control
            stream.get();  // Discard the escaping char, and avoid limiter check so char is considered as text
        }else{
            if (is_limiter(next_char) && next_char != '-') {  // Exception is for negative number handling
                break;
            }
        }

        // Read the current char
        char current = static_cast<char>(stream.get());
        if (current == -1) {
            break;
        }

        if (current == '-' && !isdigit(stream.peek())) {  // Not a negative number, rollback
            this->stream.seekg(-1, std::ios_base::cur);
            break;
        }

        if (current == '\n') { // Increment the line count if a newline was found
            this->increment_line();
            line_started = true;
        }else{
            if (!isspace(current)) {
                line_started = false;
            }
        }

        // Allow newlines and chars only if they are not the first space ( indentation )
        if ( current == '\n' || !line_started ) {
            this->buffer.push_back(current);
        }
    }

    this->buffer.push_back(0);

    return std::move(std::string{buffer.data()});
}